

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

int soplex::LPFreadColName<double>
              (char **pos,NameSet *colnames,LPColSetBase<double> *colset,LPColBase<double> *emptycol
              ,SPxOut *spxout)

{
  bool bVar1;
  int iVar2;
  Verbosity VVar3;
  char *pcVar4;
  long in_RCX;
  long *in_RDI;
  SPxOut *in_R8;
  Verbosity old_verbosity;
  int colidx;
  int i;
  char *s;
  char name [8192];
  undefined7 in_stack_ffffffffffffdfb8;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffdfc0;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffdfc4;
  int in_stack_ffffffffffffdfc8;
  int iVar7;
  NameSet *this;
  char local_2028 [8192];
  SPxOut *local_28;
  long local_20;
  long *local_8;
  
  this = (NameSet *)*in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  while( true ) {
    pcVar4 = strchr("+-.<>= ",(int)*(char *)&(this->set).theitem);
    uVar5 = false;
    if (pcVar4 == (char *)0x0) {
      uVar5 = *(char *)&(this->set).theitem != '\0';
    }
    if ((bool)uVar5 == false) break;
    this = (NameSet *)((long)&(this->set).theitem + 1);
  }
  iVar7 = 0;
  while ((NameSet *)*local_8 != this) {
    local_2028[iVar7] = *(char *)*local_8;
    iVar7 = iVar7 + 1;
    *local_8 = *local_8 + 1;
  }
  local_2028[iVar7] = '\0';
  iVar2 = NameSet::number((NameSet *)CONCAT44(iVar7,in_stack_ffffffffffffdfc8),
                          (char *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0));
  if (iVar2 < 0) {
    if (local_20 == 0) {
      if ((local_28 != (SPxOut *)0x0) && (VVar3 = SPxOut::getVerbosity(local_28), 0 < (int)VVar3)) {
        VVar3 = SPxOut::getVerbosity(local_28);
        uVar6 = 1;
        (*local_28->_vptr_SPxOut[2])(local_28,&stack0xffffffffffffdfc0);
        operator<<((SPxOut *)CONCAT44(VVar3,uVar6),(char *)CONCAT17(uVar5,in_stack_ffffffffffffdfb8)
                  );
        operator<<((SPxOut *)CONCAT44(VVar3,uVar6),(char *)CONCAT17(uVar5,in_stack_ffffffffffffdfb8)
                  );
        operator<<((SPxOut *)CONCAT44(VVar3,uVar6),(char *)CONCAT17(uVar5,in_stack_ffffffffffffdfb8)
                  );
        (*local_28->_vptr_SPxOut[2])(local_28,&stack0xffffffffffffdfc4);
      }
    }
    else {
      iVar2 = NameSet::num((NameSet *)0x13b38c);
      NameSet::add(this,(char *)CONCAT44(iVar7,iVar2));
      LPColSetBase<double>::add
                ((LPColSetBase<double> *)this,(LPColBase<double> *)CONCAT44(iVar7,iVar2));
    }
  }
  SPxOut::debug<soplex::SPxOut,_const_char_(&)[35],_char_(&)[8192],_int_&,_0>
            (local_28,(char (*) [35])"DLPFRD03 LPFreadColName [{}] = {}\n",&local_2028,
             (int *)&stack0xffffffffffffdfc8);
  bVar1 = LPFisSpace((int)*(char *)*local_8);
  if (bVar1) {
    *local_8 = *local_8 + 1;
  }
  return iVar2;
}

Assistant:

static int LPFreadColName(char*& pos, NameSet* colnames, LPColSetBase<R>& colset,
                          const LPColBase<R>* emptycol, SPxOut* spxout)
{
   assert(LPFisColName(pos));
   assert(colnames != nullptr);

   char        name[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   int         i;
   int         colidx;

   // These are the characters that are not allowed in a column name.
   while((strchr("+-.<>= ", *s) == nullptr) && (*s != '\0'))
      s++;

   for(i = 0; pos != s; i++, pos++)
      name[i] = *pos;

   name[i] = '\0';

   if((colidx = colnames->number(name)) < 0)
   {
      // We only add the name if we got an empty column.
      if(emptycol == nullptr)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD02 Unknown variable \"" << name << "\" ";)
      }
      else
      {
         colidx = colnames->num();
         colnames->add(name);
         colset.add(*emptycol);
      }
   }

   SPxOut::debug(spxout, "DLPFRD03 LPFreadColName [{}] = {}\n", name, colidx);

   if(LPFisSpace(*pos))
      pos++;

   return colidx;
}